

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::iterate(SRGBTestCase *this)

{
  pointer *pppSVar1;
  GLuint *pGVar2;
  undefined4 *puVar3;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar4;
  FragmentShaderParameters *pFVar5;
  bool *pbVar6;
  pointer *ppUVar7;
  TextureType TVar8;
  undefined4 uVar9;
  ShaderSamplingType SVar10;
  FunctionParameters FVar11;
  iterator __position;
  pointer pcVar12;
  RenderContext *renderCtx;
  pointer pUVar13;
  pointer pUVar14;
  long *plVar15;
  _func_int *__s2;
  SRGBTestTexture *this_00;
  pointer ppSVar16;
  TestContext *this_01;
  pointer pFVar17;
  ShaderUniforms SVar18;
  undefined3 uVar19;
  Blending BVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [8];
  pointer pcVar23;
  bool bVar24;
  int iVar25;
  deUint32 dVar26;
  undefined4 uVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SRGBTestProgram *pSVar28;
  undefined4 extraout_var_03;
  ostream *poVar29;
  ShaderProgram *pSVar30;
  size_t sVar31;
  pointer pUVar32;
  pointer ppSVar33;
  pointer ppSVar34;
  undefined4 extraout_var_04;
  TestError *pTVar35;
  invalid_argument *this_02;
  uint uVar36;
  long lVar37;
  code *pcVar38;
  bool bVar39;
  pointer pFVar40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  pointer pUVar42;
  size_type *psVar43;
  pointer puVar44;
  char *pcVar45;
  pointer_____offset_0x10___ *ppuVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  GLint size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderBufferTargets;
  GLenum type;
  ShaderProgramInfo buildInfo;
  ostringstream source;
  GLint maxLen;
  vector<char,_std::allocator<char>_> uniformName;
  GLint activeUniforms;
  ShaderSamplingType local_860;
  ShaderSamplingType local_85c;
  long *local_828;
  long local_820;
  long local_818 [2];
  undefined1 local_808 [8];
  _Alloc_hider local_800;
  undefined1 local_7f8 [8];
  undefined1 local_7f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d0;
  pointer local_7c0;
  pointer pbStack_7b8;
  ios_base local_798 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_778;
  _Vector_impl_data local_758 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_688;
  long local_680;
  TestLog *local_678;
  long local_670;
  string *local_668;
  undefined1 local_65c [4];
  undefined1 local_658 [48];
  undefined1 auStack_628 [24];
  undefined1 local_610 [16];
  undefined1 local_600 [360];
  undefined1 local_498 [376];
  vector<char,_std::allocator<char>_> local_320 [4];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE) {
    local_860 = TEXTURESAMPLING_TEXELFETCH;
    local_85c = TEXTURESAMPLING_TEXTURE;
  }
  else if (this->m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH) {
    local_860 = TEXTURESAMPLING_TEXELFETCH_END;
    local_85c = TEXTURESAMPLING_TEXELFETCH;
  }
  else {
    local_85c = ~TEXTURESAMPLING_TEXTURE;
    local_860 = ~TEXTURESAMPLING_TEXTURE;
  }
  iVar25 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar51 = CONCAT44(extraout_var,iVar25);
  (**(code **)(lVar51 + 0x708))(1,&this->m_vaoID);
  (**(code **)(lVar51 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar51 + 0x6c8))(1,&this->m_vertexDataID);
  (**(code **)(lVar51 + 0x40))(0x8892,this->m_vertexDataID);
  (**(code **)(lVar51 + 0x150))
            (0x8892,0x78,
             Functional::(anonymous_namespace)::SRGBTestCase::initVertexData()::squareVertexData,
             0x88e4);
  (**(code **)(lVar51 + 0x19f0))(0,3,0x1406,0,0x14,0);
  (**(code **)(lVar51 + 0x610))(0);
  (**(code **)(lVar51 + 0x19f0))(1,2,0x1406,0,0x14,0xc);
  (**(code **)(lVar51 + 0x610))(1);
  (**(code **)(lVar51 + 0xd8))(0);
  (**(code **)(lVar51 + 0x40))(0x8892,0);
  iVar25 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar51 = CONCAT44(extraout_var_00,iVar25);
  iVar25 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar27 = *(undefined4 *)CONCAT44(extraout_var_01,iVar25);
  iVar25 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  if (this->m_resultOutputTotal == 0) {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_02,"SRGBTestExecutor must have at least 1 rendered result");
    ppuVar46 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
    pcVar38 = std::invalid_argument::~invalid_argument;
  }
  else {
    uVar9 = *(undefined4 *)(CONCAT44(extraout_var_02,iVar25) + 4);
    (**(code **)(lVar51 + 0x78))
              (0x8d40,(((this->m_framebuffer).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    if (0 < this->m_resultOutputTotal) {
      iVar25 = 0;
      do {
        local_808._0_4_ = 0xffffffff;
        __position._M_current =
             (this->m_renderBufferList).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_renderBufferList).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_renderBufferList,
                     __position,(uint *)local_808);
        }
        else {
          *__position._M_current = 0xffffffff;
          (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 < this->m_resultOutputTotal);
    }
    puVar44 = (this->m_renderBufferList).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar44) {
      lVar48 = 0;
      uVar50 = 0;
      do {
        (**(code **)(lVar51 + 0x6e8))(1,(long)puVar44 + lVar48);
        (**(code **)(lVar51 + 0xa0))
                  (0x8d41,(this->m_renderBufferList).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar50]);
        pcVar38 = *(code **)(lVar51 + 0x1238);
        dVar26 = glu::getInternalFormat(this->m_resultTextureFormat);
        (*pcVar38)(0x8d41,dVar26,uVar27,uVar9);
        (**(code **)(lVar51 + 0x688))
                  (0x8d40,(int)uVar50 + 0x8ce0,0x8d41,
                   (this->m_renderBufferList).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar50]);
        dVar26 = (**(code **)(lVar51 + 0x800))();
        glu::checkError(dVar26,"Create and setup renderbuffer object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                        ,0x564);
        uVar50 = uVar50 + 1;
        puVar44 = (this->m_renderBufferList).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar48 = lVar48 + 4;
      } while (uVar50 < (ulong)((long)(this->m_renderBufferList).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar44 >>
                               2));
    }
    iVar25 = (**(code **)(lVar51 + 0x170))(0x8d40);
    if (iVar25 == 0x8cd5) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_808,
                 (long)(this->m_renderBufferList).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_renderBufferList).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)local_610);
      auVar21 = _DAT_019f5ce0;
      lVar48 = (long)(this->m_renderBufferList).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_renderBufferList).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar48 != 0) {
        lVar48 = lVar48 >> 2;
        lVar48 = lVar48 + (ulong)(lVar48 == 0);
        lVar37 = lVar48 + -1;
        auVar52._8_4_ = (int)lVar37;
        auVar52._0_8_ = lVar37;
        auVar52._12_4_ = (int)((ulong)lVar37 >> 0x20);
        uVar50 = 0;
        auVar52 = auVar52 ^ _DAT_019f5ce0;
        auVar53 = _DAT_019fcc00;
        do {
          auVar54 = auVar53 ^ auVar21;
          if ((bool)(~(auVar54._4_4_ == auVar52._4_4_ && auVar52._0_4_ < auVar54._0_4_ ||
                      auVar52._4_4_ < auVar54._4_4_) & 1)) {
            *(uint *)((long)&(((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)local_808)->
                             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>).
                             _M_impl.super__Vector_impl_data._M_start + uVar50 * 4) =
                 (int)uVar50 + 0x8ce0;
          }
          if ((auVar54._12_4_ != auVar52._12_4_ || auVar54._8_4_ <= auVar52._8_4_) &&
              auVar54._12_4_ <= auVar52._12_4_) {
            *(int *)((long)&(((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)local_808)->
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar50 * 4 + 4) =
                 (int)uVar50 + 0x8ce1;
          }
          uVar50 = uVar50 + 2;
          lVar37 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + 2;
          auVar53._8_8_ = lVar37 + 2;
        } while ((lVar48 + 1U & 0xfffffffffffffffe) != uVar50);
      }
      (**(code **)(lVar51 + 0x560))((ulong)((long)local_800._M_p - (long)local_808) >> 2);
      dVar26 = (**(code **)(lVar51 + 0x800))();
      glu::checkError(dVar26,"glDrawBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                      ,0x56e);
      (**(code **)(lVar51 + 0x78))(0x8d40);
      if (local_808 != (undefined1  [8])0x0) {
        operator_delete((void *)local_808,(long)local_7f8 - (long)local_808);
      }
      if ((int)local_85c < (int)local_860) {
        do {
          pFVar40 = (this->m_shaderParametersList).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->m_shaderParametersList).
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar40) >>
                       7)) {
            lVar51 = 0;
            do {
              pFVar40[lVar51].samplingType = local_85c;
              local_680 = lVar51;
              pSVar28 = (SRGBTestProgram *)operator_new(0xf8);
              pSVar28->m_context = (this->super_TestCase).m_context;
              pMVar4 = &pSVar28->m_program;
              (pSVar28->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr = (ShaderProgram *)0x0;
              (pSVar28->m_shaderFragmentParameters).samplingType = pFVar40[lVar51].samplingType;
              SVar18 = pFVar40[lVar51].uniformTotal;
              (pSVar28->m_shaderFragmentParameters).outputTotal = pFVar40[lVar51].outputTotal;
              (pSVar28->m_shaderFragmentParameters).uniformTotal = SVar18;
              (pSVar28->m_shaderFragmentParameters).functionName._M_dataplus._M_p =
                   (pointer)&(pSVar28->m_shaderFragmentParameters).functionName.field_2;
              pcVar12 = pFVar40[lVar51].functionName._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&(pSVar28->m_shaderFragmentParameters).functionName,pcVar12,
                         pcVar12 + pFVar40[lVar51].functionName._M_string_length);
              (pSVar28->m_shaderFragmentParameters).functionParameters =
                   pFVar40[lVar51].functionParameters;
              (pSVar28->m_shaderFragmentParameters).functionImplementation._M_dataplus._M_p =
                   (pointer)&(pSVar28->m_shaderFragmentParameters).functionImplementation.field_2;
              pcVar12 = pFVar40[lVar51].functionImplementation._M_dataplus._M_p;
              local_670 = lVar51 * 0x80;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&(pSVar28->m_shaderFragmentParameters).functionImplementation,
                         pcVar12,pcVar12 + pFVar40[lVar51].functionImplementation._M_string_length);
              (pSVar28->m_shaderFragmentParameters).toggleRequired = pFVar40[lVar51].toggleRequired;
              pFVar17 = pFVar40 + lVar51;
              uVar19 = *(undefined3 *)&pFVar17->field_0x59;
              BVar20 = pFVar17->blendRequired;
              (pSVar28->m_shaderFragmentParameters).hasFunction = pFVar17->hasFunction;
              *(undefined3 *)&(pSVar28->m_shaderFragmentParameters).field_0x59 = uVar19;
              (pSVar28->m_shaderFragmentParameters).blendRequired = BVar20;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&(pSVar28->m_shaderFragmentParameters).uniformsToToggle,
                       &pFVar40[lVar51].uniformsToToggle);
              pFVar5 = &pSVar28->m_shaderFragmentParameters;
              local_688 = &(pSVar28->m_shaderVertex).field_2;
              (pSVar28->m_shaderVertex)._M_dataplus._M_p = (pointer)local_688;
              (pSVar28->m_shaderVertex)._M_string_length = 0;
              (pSVar28->m_shaderVertex).field_2._M_local_buf[0] = '\0';
              local_690 = &(pSVar28->m_shaderFragment).field_2;
              (pSVar28->m_shaderFragment)._M_dataplus._M_p = (pointer)local_690;
              (pSVar28->m_shaderFragment)._M_string_length = 0;
              (pSVar28->m_shaderFragment).field_2._M_local_buf[0] = '\0';
              (pSVar28->m_uniformDataList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pSVar28->m_uniformDataList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              *(undefined1 (*) [16])
               ((long)&(pSVar28->m_uniformDataList).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 2) = (undefined1  [16])0x0;
              iVar25 = (*pSVar28->m_context->m_renderCtx->_vptr_RenderContext[3])();
              lVar51 = CONCAT44(extraout_var_03,iVar25);
              local_678 = pSVar28->m_context->m_testCtx->m_log;
              local_658._0_8_ = local_658 + 0x10;
              local_658._8_8_ = 0;
              local_658[0x10] = '\0';
              local_658._32_8_ = local_658._32_8_ & 0xffffffffffffff00;
              auStack_628._8_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff9d0 = (undefined1  [16])0x0;
              std::__cxx11::string::_M_replace
                        ((ulong)&pSVar28->m_shaderVertex,0,
                         (char *)(pSVar28->m_shaderVertex)._M_string_length,0x1c5adb0);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"#version 310 es \n",0x11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"in mediump vec2 vs_aTexCoord; \n",0x1f);
              if (0 < (int)pFVar5->outputTotal) {
                iVar25 = 0;
                do {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"layout (location = ",0x13);
                  poVar29 = (ostream *)std::ostream::operator<<((ostringstream *)local_610,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar29,") out mediump vec4 fs_aColor",0x1c);
                  poVar29 = (ostream *)std::ostream::operator<<(poVar29,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,"; \n",3);
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)pFVar5->outputTotal);
              }
              if (0 < (int)(pSVar28->m_shaderFragmentParameters).uniformTotal) {
                iVar25 = 0;
                do {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"uniform sampler2D uTexture",0x1a);
                  poVar29 = (ostream *)std::ostream::operator<<((ostringstream *)local_610,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,"; \n",3);
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)(pSVar28->m_shaderFragmentParameters).uniformTotal);
              }
              pbVar6 = &(pSVar28->m_shaderFragmentParameters).hasFunction;
              if (*pbVar6 != false) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,
                           (pSVar28->m_shaderFragmentParameters).functionImplementation._M_dataplus.
                           _M_p,(pSVar28->m_shaderFragmentParameters).functionImplementation.
                                _M_string_length);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"void main () \n",0xe);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"{ \n",3);
              if (0 < (int)(pSVar28->m_shaderFragmentParameters).uniformTotal) {
                iVar25 = 0;
                do {
                  SVar10 = (pSVar28->m_shaderFragmentParameters).samplingType;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_808,"\tmediump vec4 texelColor",0x18);
                  poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29," = ",3);
                  switch(SVar10) {
                  case TEXTURESAMPLING_TEXTURE:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"texture(uTexture",0x10);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x12;
                    pcVar45 = ", vs_aTexCoord); \n";
                    break;
                  case TEXTURESAMPLING_TEXTURE_LOD:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"textureLod(uTexture",0x13);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x17;
                    pcVar45 = ", vs_aTexCoord, 0.0); \n";
                    break;
                  case TEXTURESAMPLING_TEXTURE_GRAD:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"textureGrad(uTexture",0x14);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x32;
                    pcVar45 = ", vs_aTexCoord, vec2(0.0, 0.0), vec2(0.0, 0.0)); \n";
                    break;
                  case TEXTURESAMPLING_TEXTURE_OFFSET:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"textureOffset(uTexture",0x16);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x23;
                    pcVar45 = ", vs_aTexCoord, ivec2(0.0, 0.0)); \n";
                    break;
                  case TEXTURESAMPLING_TEXTURE_PROJ:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"textureProj(uTexture",0x14);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x1d;
                    pcVar45 = ", vec3(vs_aTexCoord, 1.0)); \n";
                    break;
                  case TEXTURESAMPLING_TEXELFETCH:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"texelFetch(uTexture",0x13);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x1c;
                    pcVar45 = ", ivec2(vs_aTexCoord), 0); \n";
                    break;
                  case TEXTURESAMPLING_TEXELFETCH_OFFSET:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_808,"texelFetchOffset(uTexture",0x19);
                    poVar29 = (ostream *)std::ostream::operator<<(local_808,iVar25);
                    lVar48 = 0x2d;
                    pcVar45 = ", ivec2(vs_aTexCoord), 0, ivec2(0.0, 0.0)); \n";
                    break;
                  default:
                    goto switchD_01490a0c_default;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar29,pcVar45,lVar48);
switchD_01490a0c_default:
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
                  std::ios_base::~ios_base(local_798);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,(char *)local_828,local_820);
                  if (local_828 != local_818) {
                    operator_delete(local_828,local_818[0] + 1);
                  }
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)(pSVar28->m_shaderFragmentParameters).uniformTotal);
              }
              if (*pbVar6 == false) {
                if (0 < (int)pFVar5->outputTotal) {
                  iVar25 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_498,"\tfs_aColor",10);
                    poVar29 = (ostream *)std::ostream::operator<<(local_498,iVar25);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar29," = texelColor",0xd);
                    poVar29 = (ostream *)std::ostream::operator<<(poVar29,iVar25);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar29,"; \n",3);
                    iVar25 = iVar25 + 1;
                  } while (iVar25 < (int)pFVar5->outputTotal);
                }
              }
              else {
                FVar11 = (pSVar28->m_shaderFragmentParameters).functionParameters;
                if (FVar11 == FUNCTIONPARAMETERS_ONE) {
                  lVar48 = 0xd;
                  pcVar45 = "(texelColor0)";
LAB_01490cab:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar45,lVar48);
                }
                else if (FVar11 == FUNCTIONPARAMETERS_TWO) {
                  lVar48 = 0x1a;
                  pcVar45 = "(texelColor0, texelColor1)";
                  goto LAB_01490cab;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,"\tfs_aColor0 = ",0xe);
                poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_498,
                                     (pSVar28->m_shaderFragmentParameters).functionName._M_dataplus.
                                     _M_p,(pSVar28->m_shaderFragmentParameters).functionName.
                                          _M_string_length);
                std::__cxx11::stringbuf::str();
                poVar29 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar29,(char *)local_808,(long)local_800._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar29,"; \n",3);
                if (local_808 != (undefined1  [8])local_7f8) {
                  operator_delete((void *)local_808,
                                  (ulong)((long)&((_Alloc_hider *)local_7f8)->_M_p + 1));
                }
              }
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,(char *)local_808,(long)local_800._M_p);
              if (local_808 != (undefined1  [8])local_7f8) {
                operator_delete((void *)local_808,
                                (ulong)((long)&((_Alloc_hider *)local_7f8)->_M_p + 1));
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"} \n",3);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=
                        ((string *)&pSVar28->m_shaderFragment,(string *)local_808);
              if (local_808 != (undefined1  [8])local_7f8) {
                operator_delete((void *)local_808,
                                (ulong)((long)&((_Alloc_hider *)local_7f8)->_M_p + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
              std::ios_base::~ios_base((ios_base *)(local_498 + 0x70));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
              std::ios_base::~ios_base(local_2b0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
              std::ios_base::~ios_base((ios_base *)(local_600 + 0x60));
              pSVar30 = (ShaderProgram *)operator_new(0xd0);
              renderCtx = pSVar28->m_context->m_renderCtx;
              memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_808,0,0xac);
              local_758[0]._0_9_ = SUB169((undefined1  [16])0x0,0);
              local_758[0]._M_finish._1_7_ = 0;
              local_758._16_9_ = SUB169((undefined1  [16])0x0,7);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_808,&pSVar28->m_shaderVertex);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_7f0,&pSVar28->m_shaderFragment);
              glu::ShaderProgram::ShaderProgram(pSVar30,renderCtx,(ProgramSources *)local_808);
              local_610._0_8_ = (ShaderProgram *)0x0;
              if ((pMVar4->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                  m_data.ptr != pSVar30) {
                de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::reset(&pMVar4->
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
                (pMVar4->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                m_data.ptr = pSVar30;
              }
              de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              reset((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                    local_610);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_758);
              std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
              ~vector(&local_778);
              lVar48 = 0x78;
              do {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_808 + lVar48));
                lVar48 = lVar48 + -0x18;
              } while (lVar48 != -0x18);
              pSVar30 = (pMVar4->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        ).m_data.ptr;
              if ((pSVar30->m_program).m_info.linkOk == false) {
                pTVar35 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar35,"Failed to compile shaders and link program",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                           ,0x292);
                __cxa_throw(pTVar35,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              (**(code **)(lVar51 + 0x9d8))((pSVar30->m_program).m_program,0x8b87,local_498);
              (**(code **)(lVar51 + 0x9d8))
                        ((((pMVar4->
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           ).m_data.ptr)->m_program).m_program,0x8b86,local_1a8);
              std::vector<char,_std::allocator<char>_>::vector
                        (local_320,(long)(int)local_498._0_4_,(allocator_type *)local_808);
              if (0 < (int)local_1a8._0_4_) {
                iVar25 = 0;
                do {
                  (**(code **)(lVar51 + 0x750))
                            ((((pMVar4->
                               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                               ).m_data.ptr)->m_program).m_program,iVar25,local_498._0_4_,0,
                             &local_828,local_65c,
                             local_320[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                  uVar27 = (**(code **)(lVar51 + 0xb48))
                                     ((((pMVar4->
                                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                        ).m_data.ptr)->m_program).m_program,
                                      local_320[0].super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                  pcVar23 = local_320[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  sVar31 = strlen(local_320[0].super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                  local_610._0_8_ = local_600;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_610,pcVar23,pcVar23 + sVar31);
                  local_808._0_4_ = uVar27;
                  local_800._M_p = local_7f0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_800,local_610._0_8_,
                             (undefined1 *)
                             ((long)&(((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
                                      local_610._0_8_)->
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + local_610._8_8_));
                  local_7e0._M_allocated_capacity =
                       local_7e0._M_allocated_capacity & 0xffffffffffffff00;
                  if ((ShaderProgram *)local_610._0_8_ != (ShaderProgram *)local_600) {
                    operator_delete((void *)local_610._0_8_,local_600._0_8_ + 1);
                  }
                  pUVar13 = (pSVar28->m_uniformDataList).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (pUVar13 ==
                      (pSVar28->m_uniformDataList).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    pUVar14 = (pSVar28->m_uniformDataList).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)pUVar13 - (long)pUVar14 == 0x7fffffffffffffe0) {
                      std::__throw_length_error("vector::_M_realloc_insert");
                    }
                    lVar48 = (long)pUVar13 - (long)pUVar14 >> 4;
                    uVar49 = lVar48 * -0x5555555555555555;
                    uVar50 = uVar49;
                    if (pUVar13 == pUVar14) {
                      uVar50 = 1;
                    }
                    uVar47 = uVar50 + uVar49;
                    if (0x2aaaaaaaaaaaaa9 < uVar47) {
                      uVar47 = 0x2aaaaaaaaaaaaaa;
                    }
                    if (CARRY8(uVar50,uVar49)) {
                      uVar47 = 0x2aaaaaaaaaaaaaa;
                    }
                    if (uVar47 == 0) {
                      pUVar32 = (pointer)0x0;
                    }
                    else {
                      pUVar32 = (pointer)operator_new(uVar47 * 0x30);
                    }
                    pGVar2 = &pUVar32->location + lVar48 * 4;
                    *pGVar2 = local_808._0_4_;
                    pcVar45 = (pUVar32->name).field_2._M_local_buf + lVar48 * 0x10;
                    *(char **)(pcVar45 + -0x10) = pcVar45;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)(pGVar2 + 2),local_800._M_p,
                               (code *)((long)&((_Alloc_hider *)local_7f8)->_M_p +
                                       (long)local_800._M_p));
                    (&pUVar32->toggleDecode)[lVar48 * 0x10] = (bool)local_7e0._M_local_buf[0];
                    pUVar42 = pUVar32;
                    if (pUVar13 != pUVar14) {
                      lVar48 = 0;
                      local_668 = (string *)(pGVar2 + 2);
                      do {
                        lVar37 = lVar48;
                        puVar3 = (undefined4 *)((long)&pUVar32->location + lVar37);
                        *puVar3 = *(undefined4 *)((long)&pUVar14->location + lVar37);
                        pcVar45 = (pUVar32->name).field_2._M_local_buf + lVar37;
                        *(char **)(pcVar45 + -0x10) = pcVar45;
                        lVar48 = *(long *)((long)&(pUVar14->name)._M_dataplus._M_p + lVar37);
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)(puVar3 + 2),lVar48,
                                   *(long *)((long)&(pUVar14->name)._M_string_length + lVar37) +
                                   lVar48);
                        (&pUVar32->toggleDecode)[lVar37] = (&pUVar14->toggleDecode)[lVar37];
                        lVar48 = lVar37 + 0x30;
                      } while ((pointer)((long)&pUVar14[1].location + lVar37) != pUVar13);
                      paVar41 = &(pUVar14->name).field_2;
                      do {
                        plVar15 = (long *)(((string *)(paVar41 + -1))->_M_dataplus)._M_p;
                        if (paVar41 !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar15) {
                          operator_delete(plVar15,paVar41->_M_allocated_capacity + 1);
                        }
                        pUVar42 = (pointer)((long)paVar41 + 0x18);
                        paVar41 = paVar41 + 3;
                      } while (pUVar42 != pUVar13);
                      pUVar42 = (pointer)((long)&pUVar32[1].location + lVar37);
                    }
                    if (pUVar14 != (pointer)0x0) {
                      operator_delete(pUVar14,(long)(pSVar28->m_uniformDataList).
                                                                                                        
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)pUVar14);
                    }
                    (pSVar28->m_uniformDataList).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                    ._M_impl.super__Vector_impl_data._M_start = pUVar32;
                    (pSVar28->m_uniformDataList).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pUVar42 + 1;
                    (pSVar28->m_uniformDataList).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar32 + uVar47;
                  }
                  else {
                    pUVar13->location = local_808._0_4_;
                    (pUVar13->name)._M_dataplus._M_p = (pointer)&(pUVar13->name).field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&pUVar13->name,local_800._M_p,
                               (code *)((long)&((_Alloc_hider *)local_7f8)->_M_p +
                                       (long)local_800._M_p));
                    pUVar13->toggleDecode = (bool)local_7e0._M_local_buf[0];
                    ppUVar7 = &(pSVar28->m_uniformDataList).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppUVar7 = *ppUVar7 + 1;
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_800._M_p !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f0
                     ) {
                    operator_delete(local_800._M_p,(ulong)(local_7f0._0_8_ + 1));
                  }
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)local_1a8._0_4_);
              }
              pSVar30 = (pMVar4->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        ).m_data.ptr;
              std::__cxx11::string::_M_assign((string *)local_658);
              lVar51 = local_670;
              local_658._32_8_ = *(undefined8 *)&(pSVar30->m_program).m_info.linkOk;
              local_658._40_8_ = (pSVar30->m_program).m_info.linkTimeUs;
              lVar48 = 0;
              bVar24 = true;
              do {
                bVar39 = bVar24;
                lVar48 = **(long **)&((pMVar4->
                                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                      ).m_data.ptr)->m_shaders[lVar48].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data;
                local_808._0_4_ = *(undefined4 *)(lVar48 + 0x10);
                local_800._M_p = local_7f0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_800,*(long *)(lVar48 + 0x18),
                           *(long *)(lVar48 + 0x20) + *(long *)(lVar48 + 0x18));
                local_7e0._M_allocated_capacity = (size_type)&local_7d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_7f0)->field_2,*(long *)(lVar48 + 0x38),
                           *(long *)(lVar48 + 0x40) + *(long *)(lVar48 + 0x38));
                local_7c0 = *(pointer *)(lVar48 + 0x58);
                pbStack_7b8 = *(pointer *)(lVar48 + 0x60);
                std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::push_back
                          ((vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_> *)auStack_628,
                           (value_type *)local_808);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7e0._M_allocated_capacity != &local_7d0) {
                  operator_delete((void *)local_7e0._M_allocated_capacity,
                                  (ulong)(local_7d0._M_allocated_capacity + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_800._M_p !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7f0)
                {
                  operator_delete(local_800._M_p,(ulong)(local_7f0._0_8_ + 1));
                }
                lVar48 = 1;
                bVar24 = false;
              } while (bVar39);
              glu::operator<<(local_678,(ShaderProgramInfo *)local_658);
              if (local_320[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (char *)0x0) {
                operator_delete(local_320[0].super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_320[0].super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_320[0].super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::~vector
                        ((vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_> *)auStack_628);
              if ((undefined1 *)local_658._0_8_ != local_658 + 0x10) {
                operator_delete((void *)local_658._0_8_,
                                CONCAT71(local_658._17_7_,local_658[0x10]) + 1);
              }
              pFVar40 = (this->m_shaderParametersList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (*(int *)((long)&pFVar40->blendRequired + lVar51) == 0) {
                pSVar28->m_blendRequired = true;
              }
              if (*(int *)((long)&pFVar40->toggleRequired + lVar51) == 0) {
                pSVar28->m_toggleRequired = true;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_808,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&(pFVar40->uniformsToToggle).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar51));
                auVar22 = local_808;
                uVar36 = (uint)((ulong)((long)local_800._M_p - (long)local_808) >> 5);
                if (0 < (int)uVar36) {
                  uVar50 = 0;
                  do {
                    pUVar13 = (pSVar28->m_uniformDataList).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar51 = (long)(pSVar28->m_uniformDataList).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13;
                    if (lVar51 == 0) {
LAB_01491981:
                      pTVar35 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar35,
                                 "Error: If name correctly requested then glGetActiveUniforms() returned active uniform data incorrectly"
                                 ,(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                                 ,0x2e5);
LAB_014919ac:
                      __cxa_throw(pTVar35,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                    }
                    __s2 = (_func_int *)
                           ((_Alloc_hider *)
                           ((long)(vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)auVar22 +
                           uVar50 * 0x20))->_M_p;
                    sVar31 = *(size_t *)
                              ((long)(vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
                                     auVar22 + uVar50 * 0x20 + 8);
                    lVar48 = (lVar51 >> 4) * -0x5555555555555555;
                    lVar51 = lVar48 + (ulong)(lVar48 == 0);
                    psVar43 = &(pUVar13->name)._M_string_length;
                    while ((*psVar43 != sVar31 ||
                           ((sVar31 != 0 &&
                            (iVar25 = bcmp((((string *)(psVar43 + -1))->_M_dataplus)._M_p,__s2,
                                           sVar31), iVar25 != 0))))) {
                      psVar43 = psVar43 + 6;
                      lVar51 = lVar51 + -1;
                      if (lVar51 == 0) goto LAB_01491981;
                    }
                    iVar25 = (int)psVar43[-2];
                    if (((long)iVar25 < 0) || ((int)lVar48 < iVar25)) {
                      pTVar35 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar35,
                                 "Error: Uniform location not found. glGetActiveUniforms returned uniforms incorrectly "
                                 ,(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                                 ,0x2c8);
                      goto LAB_014919ac;
                    }
                    pUVar13[iVar25].toggleDecode = true;
                    uVar50 = uVar50 + 1;
                  } while (uVar50 != (uVar36 & 0x7fffffff));
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_808);
              }
              ppSVar33 = (this->m_shaderProgramList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if (ppSVar33 ==
                  (this->m_shaderProgramList).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ppSVar16 = (this->m_shaderProgramList).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                sVar31 = (long)ppSVar33 - (long)ppSVar16;
                if (sVar31 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar49 = (long)sVar31 >> 3;
                uVar50 = uVar49;
                if (ppSVar33 == ppSVar16) {
                  uVar50 = 1;
                }
                uVar47 = uVar50 + uVar49;
                if (0xffffffffffffffe < uVar47) {
                  uVar47 = 0xfffffffffffffff;
                }
                if (CARRY8(uVar50,uVar49)) {
                  uVar47 = 0xfffffffffffffff;
                }
                if (uVar47 == 0) {
                  ppSVar33 = (pointer)0x0;
                }
                else {
                  ppSVar33 = (pointer)operator_new(uVar47 * 8);
                }
                ppSVar33[uVar49] = pSVar28;
                if (0 < (long)sVar31) {
                  memmove(ppSVar33,ppSVar16,sVar31);
                }
                if (ppSVar16 != (pointer)0x0) {
                  operator_delete(ppSVar16,(long)(this->m_shaderProgramList).
                                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           - (long)ppSVar16);
                }
                (this->m_shaderProgramList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_start = ppSVar33;
                (this->m_shaderProgramList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppSVar33 + sVar31 + 8);
                (this->m_shaderProgramList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = ppSVar33 + uVar47;
              }
              else {
                *ppSVar33 = pSVar28;
                pppSVar1 = &(this->m_shaderProgramList).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppSVar1 = *pppSVar1 + 1;
              }
              lVar51 = local_680 + 1;
              pFVar40 = (this->m_shaderParametersList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar51 < (int)((ulong)((long)(this->m_shaderParametersList).
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pFVar40) >> 7));
          }
          ppSVar34 = (this->m_textureSourceList).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((this->m_textureSourceList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppSVar34) {
            uVar50 = 0;
            do {
              glu::Texture2D::upload(&ppSVar34[uVar50]->m_source);
              this_00 = (this->m_textureSourceList).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar50];
              iVar25 = (*this_00->m_context->m_renderCtx->_vptr_RenderContext[3])();
              lVar51 = CONCAT44(extraout_var_04,iVar25);
              (**(code **)(lVar51 + 0xb8))
                        (-(uint)(this_00->m_targetType != TEXTURETYPE_2D) | 0xde1,
                         (this_00->m_source).m_glTexture);
              pcVar38 = *(code **)(lVar51 + 0x1360);
              TVar8 = this_00->m_targetType;
              dVar26 = glu::getGLWrapMode(this_00->m_wrapS);
              (*pcVar38)(-(uint)(TVar8 != TEXTURETYPE_2D) | 0xde1,0x2802,dVar26);
              pcVar38 = *(code **)(lVar51 + 0x1360);
              TVar8 = this_00->m_targetType;
              dVar26 = glu::getGLWrapMode(this_00->m_wrapT);
              (*pcVar38)(-(uint)(TVar8 != TEXTURETYPE_2D) | 0xde1,0x2803,dVar26);
              pcVar38 = *(code **)(lVar51 + 0x1360);
              TVar8 = this_00->m_targetType;
              dVar26 = glu::getGLFilterMode(this_00->m_minFilter);
              (*pcVar38)(-(uint)(TVar8 != TEXTURETYPE_2D) | 0xde1,0x2801,dVar26);
              pcVar38 = *(code **)(lVar51 + 0x1360);
              TVar8 = this_00->m_targetType;
              dVar26 = glu::getGLFilterMode(this_00->m_magFilter);
              (*pcVar38)(-(uint)(TVar8 != TEXTURETYPE_2D) | 0xde1,0x2800,dVar26);
              (**(code **)(lVar51 + 0xb8))
                        (-(uint)(this_00->m_targetType != TEXTURETYPE_2D) | 0xde1,0);
              SRGBTestTexture::setDecode(this_00,this_00->m_decoding);
              uVar50 = uVar50 + 1;
              ppSVar34 = (this->m_textureSourceList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar50 < (ulong)((long)(this->m_textureSourceList).
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppSVar34 >> 3));
          }
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
          iVar25 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
          ppSVar33 = (this->m_shaderProgramList).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((this->m_shaderProgramList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppSVar33) {
            uVar50 = 0;
            do {
              pSVar28 = ppSVar33[uVar50];
              if (pSVar28 != (SRGBTestProgram *)0x0) {
                local_808 = (undefined1  [8])0x0;
                pMVar4 = &pSVar28->m_program;
                if ((pSVar28->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr != (ShaderProgram *)0x0) {
                  de::details::
                  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                            (&pMVar4->
                              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                            );
                  (pMVar4->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                  m_data.ptr = (ShaderProgram *)0x0;
                }
                de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::reset((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                        local_808);
                std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                ::~vector(&pSVar28->m_uniformDataList);
                pcVar12 = (pSVar28->m_shaderFragment)._M_dataplus._M_p;
                paVar41 = &(pSVar28->m_shaderFragment).field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar12 != paVar41) {
                  operator_delete(pcVar12,paVar41->_M_allocated_capacity + 1);
                }
                pcVar12 = (pSVar28->m_shaderVertex)._M_dataplus._M_p;
                paVar41 = &(pSVar28->m_shaderVertex).field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar12 != paVar41) {
                  operator_delete(pcVar12,paVar41->_M_allocated_capacity + 1);
                }
                FragmentShaderParameters::~FragmentShaderParameters
                          (&pSVar28->m_shaderFragmentParameters);
                de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::reset(&pMVar4->
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
              }
              operator_delete(pSVar28,0xf8);
              uVar50 = uVar50 + 1;
              ppSVar33 = (this->m_shaderProgramList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppSVar16 = (this->m_shaderProgramList).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar50 < (ulong)((long)ppSVar16 - (long)ppSVar33 >> 3));
            if (ppSVar16 != ppSVar33) {
              (this->m_shaderProgramList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppSVar33;
            }
          }
          this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
          if ((char)iVar25 == '\0') {
            tcu::TestContext::setTestResult
                      (this_01,QP_TEST_RESULT_FAIL,"Result verification failed");
            return STOP;
          }
          tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
          local_85c = local_85c + TEXTURESAMPLING_TEXTURE_LOD;
        } while (local_85c != local_860);
      }
      return STOP;
    }
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_02,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
               ,0x566);
    ppuVar46 = &tcu::TestError::typeinfo;
    pcVar38 = tcu::Exception::~Exception;
  }
  __cxa_throw(this_02,ppuVar46,pcVar38);
}

Assistant:

SRGBTestCase::IterateResult SRGBTestCase::iterate (void)
{
	bool	result;
	int		startIdx	= -1;
	int		endIdx		= -1;

	this->setupTest();

	if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXTURE)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXTURE_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXTURE_END);
	}
	else if (m_samplingGroup == SHADERSAMPLINGGROUP_TEXEL_FETCH)
	{
		startIdx	= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_START);
		endIdx		= static_cast<int>(TEXTURESAMPLING_TEXELFETCH_END);
	}
	else
	{
		DE_FATAL("Error: Sampling group not defined");
	}

	this->initVertexData();
	this->initFrameBuffer();

	// loop through all sampling types in the required sampling group, performing individual tests for each
	for (int samplingTypeIdx = startIdx; samplingTypeIdx < endIdx; samplingTypeIdx++)
	{
		this->genShaderPrograms(static_cast<ShaderSamplingType>(samplingTypeIdx));
		this->uploadTextures();
		this->render();

		result = this->verifyResult();

		this->deleteShaderPrograms();

		if (result == true)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	return STOP;
}